

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cc
# Opt level: O1

void __thiscall absl::lts_20250127::crc_internal::CRC32::InitTables(CRC32 *this)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  uint32_t *t;
  long lVar4;
  uint32_t *puVar5;
  uint *extraout_RDX;
  uint *puVar6;
  uint uVar7;
  ulong uVar8;
  uint32_t *t_00;
  uint uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  
  t = (uint32_t *)operator_new__(0x1000);
  uVar8 = 0x82f63b78;
  CRCImpl::FillWordTable(0x82f63b78,0x82f63b78,1,(Uint32By256 *)t);
  memcpy(this->table0_,t,0x400);
  lVar4 = 0xc;
  do {
    uVar7 = (uint)(uVar8 >> 8) ^ this->table0_[uVar8 & 0xff];
    uVar8 = (ulong)uVar7;
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  puVar5 = t;
  CRCImpl::FillWordTable(0x82f63b78,uVar7,4,(Uint32By256 *)t);
  lVar4 = 0;
  do {
    memcpy((void *)((long)this->table_[0] + lVar4),(void *)((long)t + lVar4),0x400);
    lVar4 = lVar4 + 0x400;
  } while (lVar4 != 0x1000);
  lVar4 = 0x82f63b78;
  t_00 = t;
  uVar7 = CRCImpl::FillZeroesTable(0x82f63b78,(Uint32By256 *)t);
  if ((int)uVar7 < 0x101) {
    if (0 < (int)uVar7) {
      memcpy(this->zeroes_,t,(ulong)uVar7 << 2);
    }
    operator_delete__(t);
    puVar5 = this->reverse_table0_;
    CRCImpl::FillWordTable(0x8f6e37a0,0x8f6e37a0,1,&puVar5);
    t_00 = this->reverse_zeroes_;
    lVar4 = 0x8f6e37a0;
    iVar3 = CRCImpl::FillZeroesTable(0x8f6e37a0,&t_00);
    if (iVar3 < 0x101) {
      return;
    }
  }
  else {
    InitTables();
  }
  InitTables();
  puVar1 = (uint *)((long)extraout_RDX + (long)puVar5);
  uVar7 = *t_00;
  puVar6 = extraout_RDX;
  if ((uint32_t *)0xf < puVar5) {
    uVar7 = uVar7 ^ *extraout_RDX;
    uVar12 = extraout_RDX[1];
    uVar16 = extraout_RDX[2];
    uVar13 = extraout_RDX[3];
    puVar6 = extraout_RDX + 4;
    if (0x110 < (long)puVar5) {
      puVar5 = puVar5 + -4;
      do {
        uVar7 = *(uint *)(lVar4 + 0x1408 + (ulong)(uVar7 & 0xff) * 4) ^ *puVar6 ^
                *(uint *)(lVar4 + 0x1008 + (ulong)(uVar7 >> 8 & 0xff) * 4) ^
                *(uint *)(lVar4 + 0xc08 + (ulong)(uVar7 >> 0xe & 0x3fc)) ^
                *(uint *)(lVar4 + 0x808 + (ulong)(uVar7 >> 0x18) * 4);
        uVar12 = *(uint *)(lVar4 + 0x1408 + (ulong)(uVar12 & 0xff) * 4) ^ puVar6[1] ^
                 *(uint *)(lVar4 + 0x1008 + (ulong)(uVar12 >> 8 & 0xff) * 4) ^
                 *(uint *)(lVar4 + 0xc08 + (ulong)(uVar12 >> 0xe & 0x3fc)) ^
                 *(uint *)(lVar4 + 0x808 + (ulong)(uVar12 >> 0x18) * 4);
        uVar16 = *(uint *)(lVar4 + 0x1408 + (ulong)(uVar16 & 0xff) * 4) ^ puVar6[2] ^
                 *(uint *)(lVar4 + 0x1008 + (ulong)(uVar16 >> 8 & 0xff) * 4) ^
                 *(uint *)(lVar4 + 0xc08 + (ulong)(uVar16 >> 0xe & 0x3fc)) ^
                 *(uint *)(lVar4 + 0x808 + (ulong)(uVar16 >> 0x18) * 4);
        uVar13 = *(uint *)(lVar4 + 0x1408 + (ulong)(uVar13 & 0xff) * 4) ^ puVar6[3] ^
                 *(uint *)(lVar4 + 0x1008 + (ulong)(uVar13 >> 8 & 0xff) * 4) ^
                 *(uint *)(lVar4 + 0xc08 + (ulong)(uVar13 >> 0xe & 0x3fc)) ^
                 *(uint *)(lVar4 + 0x808 + (ulong)(uVar13 >> 0x18) * 4);
        uVar7 = *(uint *)(lVar4 + 0x1408 + (ulong)(uVar7 & 0xff) * 4) ^ puVar6[4] ^
                *(uint *)(lVar4 + 0x1008 + (ulong)(uVar7 >> 8 & 0xff) * 4) ^
                *(uint *)(lVar4 + 0xc08 + (ulong)(uVar7 >> 0xe & 0x3fc)) ^
                *(uint *)(lVar4 + 0x808 + (ulong)(uVar7 >> 0x18) * 4);
        uVar12 = *(uint *)(lVar4 + 0x1408 + (ulong)(uVar12 & 0xff) * 4) ^ puVar6[5] ^
                 *(uint *)(lVar4 + 0x1008 + (ulong)(uVar12 >> 8 & 0xff) * 4) ^
                 *(uint *)(lVar4 + 0xc08 + (ulong)(uVar12 >> 0xe & 0x3fc)) ^
                 *(uint *)(lVar4 + 0x808 + (ulong)(uVar12 >> 0x18) * 4);
        uVar16 = *(uint *)(lVar4 + 0x1408 + (ulong)(uVar16 & 0xff) * 4) ^ puVar6[6] ^
                 *(uint *)(lVar4 + 0x1008 + (ulong)(uVar16 >> 8 & 0xff) * 4) ^
                 *(uint *)(lVar4 + 0xc08 + (ulong)(uVar16 >> 0xe & 0x3fc)) ^
                 *(uint *)(lVar4 + 0x808 + (ulong)(uVar16 >> 0x18) * 4);
        uVar13 = *(uint *)(lVar4 + 0x1408 + (ulong)(uVar13 & 0xff) * 4) ^ puVar6[7] ^
                 *(uint *)(lVar4 + 0x1008 + (ulong)(uVar13 >> 8 & 0xff) * 4) ^
                 *(uint *)(lVar4 + 0xc08 + (ulong)(uVar13 >> 0xe & 0x3fc)) ^
                 *(uint *)(lVar4 + 0x808 + (ulong)(uVar13 >> 0x18) * 4);
        uVar7 = *(uint *)(lVar4 + 0x1408 + (ulong)(uVar7 & 0xff) * 4) ^ puVar6[8] ^
                *(uint *)(lVar4 + 0x1008 + (ulong)(uVar7 >> 8 & 0xff) * 4) ^
                *(uint *)(lVar4 + 0xc08 + (ulong)(uVar7 >> 0xe & 0x3fc)) ^
                *(uint *)(lVar4 + 0x808 + (ulong)(uVar7 >> 0x18) * 4);
        uVar12 = *(uint *)(lVar4 + 0x1408 + (ulong)(uVar12 & 0xff) * 4) ^ puVar6[9] ^
                 *(uint *)(lVar4 + 0x1008 + (ulong)(uVar12 >> 8 & 0xff) * 4) ^
                 *(uint *)(lVar4 + 0xc08 + (ulong)(uVar12 >> 0xe & 0x3fc)) ^
                 *(uint *)(lVar4 + 0x808 + (ulong)(uVar12 >> 0x18) * 4);
        uVar16 = *(uint *)(lVar4 + 0x1408 + (ulong)(uVar16 & 0xff) * 4) ^ puVar6[10] ^
                 *(uint *)(lVar4 + 0x1008 + (ulong)(uVar16 >> 8 & 0xff) * 4) ^
                 *(uint *)(lVar4 + 0xc08 + (ulong)(uVar16 >> 0xe & 0x3fc)) ^
                 *(uint *)(lVar4 + 0x808 + (ulong)(uVar16 >> 0x18) * 4);
        uVar13 = *(uint *)(lVar4 + 0x1408 + (ulong)(uVar13 & 0xff) * 4) ^ puVar6[0xb] ^
                 *(uint *)(lVar4 + 0x1008 + (ulong)(uVar13 >> 8 & 0xff) * 4) ^
                 *(uint *)(lVar4 + 0xc08 + (ulong)(uVar13 >> 0xe & 0x3fc)) ^
                 *(uint *)(lVar4 + 0x808 + (ulong)(uVar13 >> 0x18) * 4);
        uVar7 = *(uint *)(lVar4 + 0x1408 + (ulong)(uVar7 & 0xff) * 4) ^ puVar6[0xc] ^
                *(uint *)(lVar4 + 0x1008 + (ulong)(uVar7 >> 8 & 0xff) * 4) ^
                *(uint *)(lVar4 + 0xc08 + (ulong)(uVar7 >> 0xe & 0x3fc)) ^
                *(uint *)(lVar4 + 0x808 + (ulong)(uVar7 >> 0x18) * 4);
        uVar12 = *(uint *)(lVar4 + 0x1408 + (ulong)(uVar12 & 0xff) * 4) ^ puVar6[0xd] ^
                 *(uint *)(lVar4 + 0x1008 + (ulong)(uVar12 >> 8 & 0xff) * 4) ^
                 *(uint *)(lVar4 + 0xc08 + (ulong)(uVar12 >> 0xe & 0x3fc)) ^
                 *(uint *)(lVar4 + 0x808 + (ulong)(uVar12 >> 0x18) * 4);
        uVar16 = *(uint *)(lVar4 + 0x1408 + (ulong)(uVar16 & 0xff) * 4) ^ puVar6[0xe] ^
                 *(uint *)(lVar4 + 0x1008 + (ulong)(uVar16 >> 8 & 0xff) * 4) ^
                 *(uint *)(lVar4 + 0xc08 + (ulong)(uVar16 >> 0xe & 0x3fc)) ^
                 *(uint *)(lVar4 + 0x808 + (ulong)(uVar16 >> 0x18) * 4);
        uVar13 = *(uint *)(lVar4 + 0x1408 + (ulong)(uVar13 & 0xff) * 4) ^ puVar6[0xf] ^
                 *(uint *)(lVar4 + 0x1008 + (ulong)(uVar13 >> 8 & 0xff) * 4) ^
                 *(uint *)(lVar4 + 0xc08 + (ulong)(uVar13 >> 0xe & 0x3fc)) ^
                 *(uint *)(lVar4 + 0x808 + (ulong)(uVar13 >> 0x18) * 4);
        puVar6 = puVar6 + 0x10;
        puVar5 = puVar5 + -0x10;
      } while (0x100 < (long)puVar5);
    }
    for (uVar8 = (long)puVar1 - (long)puVar6; 0xf < uVar8; uVar8 = uVar8 - 0x10) {
      uVar7 = *(uint *)(lVar4 + 0x1408 + (ulong)(uVar7 & 0xff) * 4) ^ *puVar6 ^
              *(uint *)(lVar4 + 0x1008 + (ulong)(uVar7 >> 8 & 0xff) * 4) ^
              *(uint *)(lVar4 + 0xc08 + (ulong)(uVar7 >> 0xe & 0x3fc)) ^
              *(uint *)(lVar4 + 0x808 + (ulong)(uVar7 >> 0x18) * 4);
      uVar12 = *(uint *)(lVar4 + 0x1408 + (ulong)(uVar12 & 0xff) * 4) ^ puVar6[1] ^
               *(uint *)(lVar4 + 0x1008 + (ulong)(uVar12 >> 8 & 0xff) * 4) ^
               *(uint *)(lVar4 + 0xc08 + (ulong)(uVar12 >> 0xe & 0x3fc)) ^
               *(uint *)(lVar4 + 0x808 + (ulong)(uVar12 >> 0x18) * 4);
      uVar16 = *(uint *)(lVar4 + 0x1408 + (ulong)(uVar16 & 0xff) * 4) ^ puVar6[2] ^
               *(uint *)(lVar4 + 0x1008 + (ulong)(uVar16 >> 8 & 0xff) * 4) ^
               *(uint *)(lVar4 + 0xc08 + (ulong)(uVar16 >> 0xe & 0x3fc)) ^
               *(uint *)(lVar4 + 0x808 + (ulong)(uVar16 >> 0x18) * 4);
      uVar13 = *(uint *)(lVar4 + 0x1408 + (ulong)(uVar13 & 0xff) * 4) ^ puVar6[3] ^
               *(uint *)(lVar4 + 0x1008 + (ulong)(uVar13 >> 8 & 0xff) * 4) ^
               *(uint *)(lVar4 + 0xc08 + (ulong)(uVar13 >> 0xe & 0x3fc)) ^
               *(uint *)(lVar4 + 0x808 + (ulong)(uVar13 >> 0x18) * 4);
      puVar6 = puVar6 + 4;
    }
    for (uVar8 = (long)puVar1 - (long)puVar6; 3 < uVar8; uVar8 = uVar8 - 4) {
      uVar9 = uVar7 & 0xff;
      uVar2 = *puVar6;
      uVar14 = uVar7 >> 8;
      uVar15 = uVar7 >> 0xe;
      uVar10 = uVar7 >> 0x18;
      puVar6 = puVar6 + 1;
      uVar7 = uVar12;
      uVar12 = uVar16;
      uVar16 = uVar13;
      uVar13 = *(uint *)(lVar4 + 0x1408 + (ulong)uVar9 * 4) ^ uVar2 ^
               *(uint *)(lVar4 + 0x1008 + (ulong)(uVar14 & 0xff) * 4) ^
               *(uint *)(lVar4 + 0xc08 + (ulong)(uVar15 & 0x3fc)) ^
               *(uint *)(lVar4 + 0x808 + (ulong)uVar10 * 4);
    }
    lVar11 = 4;
    do {
      uVar7 = uVar7 >> 8 ^ *(uint *)(lVar4 + 8 + ((ulong)uVar7 & 0xff) * 4);
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
    uVar7 = uVar7 ^ uVar12;
    lVar11 = 4;
    do {
      uVar7 = uVar7 >> 8 ^ *(uint *)(lVar4 + 8 + (ulong)(uVar7 & 0xff) * 4);
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
    uVar7 = uVar7 ^ uVar16;
    lVar11 = 4;
    do {
      uVar7 = uVar7 >> 8 ^ *(uint *)(lVar4 + 8 + (ulong)(uVar7 & 0xff) * 4);
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
    uVar7 = uVar7 ^ uVar13;
    lVar11 = 4;
    do {
      uVar7 = uVar7 >> 8 ^ *(uint *)(lVar4 + 8 + (ulong)(uVar7 & 0xff) * 4);
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
  }
  for (; puVar6 != puVar1; puVar6 = (uint *)((long)puVar6 + 1)) {
    uVar7 = uVar7 >> 8 ^ *(uint *)(lVar4 + 8 + (ulong)((uint)(byte)*puVar6 ^ uVar7 & 0xff) * 4);
  }
  *t_00 = uVar7;
  return;
}

Assistant:

void CRC32::InitTables() {
  // Compute the table for extending a CRC by one byte.
  Uint32By256* t = new Uint32By256[4];
  FillWordTable(kCrc32cPoly, kCrc32cPoly, 1, t);
  for (int i = 0; i != 256; i++) {
    this->table0_[i] = t[0][i];
  }

  // Construct a table for updating the CRC by 4 bytes data followed by
  // 12 bytes of zeroes.
  //
  // Note: the data word size could be larger than the CRC size; it might
  // be slightly faster to use a 64-bit data word, but doing so doubles the
  // table size.
  uint32_t last = kCrc32cPoly;
  const size_t size = 12;
  for (size_t i = 0; i < size; ++i) {
    last = (last >> 8) ^ this->table0_[last & 0xff];
  }
  FillWordTable(kCrc32cPoly, last, 4, t);
  for (size_t b = 0; b < 4; ++b) {
    for (int i = 0; i < 256; ++i) {
      this->table_[b][i] = t[b][i];
    }
  }

  int j = FillZeroesTable(kCrc32cPoly, t);
  ABSL_RAW_CHECK(j <= static_cast<int>(ABSL_ARRAYSIZE(this->zeroes_)), "");
  for (int i = 0; i < j; i++) {
    this->zeroes_[i] = t[0][i];
  }

  delete[] t;

  // Build up tables for _reversing_ the operation of doing CRC operations on
  // zero bytes.

  // In C++, extending `crc` by a single zero bit is done by the following:
  // (A)  bool low_bit_set = (crc & 1);
  //      crc >>= 1;
  //      if (low_bit_set) crc ^= kCrc32cPoly;
  //
  // In particular note that the high bit of `crc` after this operation will be
  // set if and only if the low bit of `crc` was set before it.  This means that
  // no information is lost, and the operation can be reversed, as follows:
  // (B)  bool high_bit_set = (crc & 0x80000000u);
  //      if (high_bit_set) crc ^= kCrc32cPoly;
  //      crc <<= 1;
  //      if (high_bit_set) crc ^= 1;
  //
  // Or, equivalently:
  // (C)  bool high_bit_set = (crc & 0x80000000u);
  //      crc <<= 1;
  //      if (high_bit_set) crc ^= ((kCrc32cPoly << 1) ^ 1);
  //
  // The last observation is, if we store our checksums in variable `rcrc`,
  // with order of the bits reversed, the inverse operation becomes:
  // (D)  bool low_bit_set = (rcrc & 1);
  //      rcrc >>= 1;
  //      if (low_bit_set) rcrc ^= ReverseBits((kCrc32cPoly << 1) ^ 1)
  //
  // This is the same algorithm (A) that we started with, only with a different
  // polynomial bit pattern.  This means that by building up our tables with
  // this alternate polynomial, we can apply the CRC algorithms to a
  // bit-reversed CRC checksum to perform inverse zero-extension.

  const uint32_t kCrc32cUnextendPoly =
      ReverseBits(static_cast<uint32_t>((kCrc32cPoly << 1) ^ 1));
  FillWordTable(kCrc32cUnextendPoly, kCrc32cUnextendPoly, 1, &reverse_table0_);

  j = FillZeroesTable(kCrc32cUnextendPoly, &reverse_zeroes_);
  ABSL_RAW_CHECK(j <= static_cast<int>(ABSL_ARRAYSIZE(this->reverse_zeroes_)),
                 "");
}